

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O1

void __thiscall IR::AutoReuseOpnd::~AutoReuseOpnd(AutoReuseOpnd *this)

{
  undefined1 *puVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if (this->wasInUse == false) {
    pOVar2 = this->opnd;
    if ((pOVar2->field_0xb & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x2a,"(m_inUse)","Expected inUse to be set...");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    puVar1 = &pOVar2->field_0xb;
    *puVar1 = *puVar1 & 0xfd;
    if (this->autoDelete == true) {
      Opnd::Free(this->opnd,this->func);
    }
  }
  return;
}

Assistant:

~AutoReuseOpnd()
    {
        if(wasInUse)
        {
            return;
        }

        opnd->UnUse();
        if(autoDelete)
        {
            opnd->Free(func);
        }
    }